

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_manager.cpp
# Opt level: O1

void __thiscall jessilib::impl::timer_manager::~timer_manager(timer_manager *this)

{
  list<std::shared_ptr<jessilib::impl::timer_context>,_std::allocator<std::shared_ptr<jessilib::impl::timer_context>_>_>
  *this_00;
  
  LOCK();
  (this->m_thread_active)._M_base._M_i = false;
  UNLOCK();
  std::condition_variable::notify_one();
  std::thread::join();
  thread_pool::join(&this->m_pool);
  this_00 = &this->m_detached_timers;
  std::__cxx11::
  _List_base<std::shared_ptr<jessilib::impl::timer_context>,_std::allocator<std::shared_ptr<jessilib::impl::timer_context>_>_>
  ::_M_clear(&this_00->
              super__List_base<std::shared_ptr<jessilib::impl::timer_context>,_std::allocator<std::shared_ptr<jessilib::impl::timer_context>_>_>
            );
  (this->m_detached_timers).
  super__List_base<std::shared_ptr<jessilib::impl::timer_context>,_std::allocator<std::shared_ptr<jessilib::impl::timer_context>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->m_detached_timers).
  super__List_base<std::shared_ptr<jessilib::impl::timer_context>,_std::allocator<std::shared_ptr<jessilib::impl::timer_context>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->m_detached_timers).
  super__List_base<std::shared_ptr<jessilib::impl::timer_context>,_std::allocator<std::shared_ptr<jessilib::impl::timer_context>_>_>
  ._M_impl._M_node._M_size = 0;
  if ((this->m_thread)._M_id._M_thread == 0) {
    std::condition_variable::~condition_variable(&this->m_cvar);
    std::
    _Rb_tree<jessilib::impl::timer_context_*,_jessilib::impl::timer_context_*,_std::_Identity<jessilib::impl::timer_context_*>,_jessilib::impl::timer_manager::timer_sort,_std::allocator<jessilib::impl::timer_context_*>_>
    ::~_Rb_tree(&(this->m_active_timers)._M_t);
    std::__cxx11::
    _List_base<std::shared_ptr<jessilib::impl::timer_context>,_std::allocator<std::shared_ptr<jessilib::impl::timer_context>_>_>
    ::_M_clear(&this_00->
                super__List_base<std::shared_ptr<jessilib::impl::timer_context>,_std::allocator<std::shared_ptr<jessilib::impl::timer_context>_>_>
              );
    thread_pool::~thread_pool(&this->m_pool);
    return;
  }
  std::terminate();
}

Assistant:

timer_manager::~timer_manager() {
	m_thread_active = false;
	m_cvar.notify_one();
	m_thread.join();
	m_pool.join();
	m_detached_timers.clear();
}